

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qitemselectionmodel.cpp
# Opt level: O2

void __thiscall
QItemSelectionModelPrivate::layoutAboutToBeChanged
          (QItemSelectionModelPrivate *this,QList<QPersistentModelIndex> *param_1,
          LayoutChangeHint hint)

{
  QObjectCompatProperty<QItemSelectionModelPrivate,_QAbstractItemModel_*,_&QItemSelectionModelPrivate::_qt_property_model_offset,_&QItemSelectionModelPrivate::setModel,_&QItemSelectionModelPrivate::modelChanged,_nullptr>
  *this_00;
  QAbstractItemModel *pQVar1;
  int iVar2;
  long in_FS_OFFSET;
  QModelIndex local_68;
  QItemSelectionRange local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  QList<QPersistentModelIndex>::clear(&this->savedPersistentIndexes);
  QList<QPersistentModelIndex>::clear(&this->savedPersistentCurrentIndexes);
  QList<std::pair<QPersistentModelIndex,_unsigned_int>_>::clear(&this->savedPersistentRowLengths);
  QList<std::pair<QPersistentModelIndex,_unsigned_int>_>::clear
            (&this->savedPersistentCurrentRowLengths);
  if (((this->ranges).super_QList<QItemSelectionRange>.d.size == 0) &&
     ((this->currentSelection).super_QList<QItemSelectionRange>.d.size == 1)) {
    local_48.tl.d = (QPersistentModelIndexData *)&DAT_aaaaaaaaaaaaaaaa;
    local_48.br.d = (QPersistentModelIndexData *)&DAT_aaaaaaaaaaaaaaaa;
    QItemSelectionRange::QItemSelectionRange
              (&local_48,(this->currentSelection).super_QList<QItemSelectionRange>.d.ptr);
    local_68.m.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
    local_68._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_68.i = (quintptr)&DAT_aaaaaaaaaaaaaaaa;
    QPersistentModelIndex::parent(&local_68,&local_48.tl);
    this_00 = &this->model;
    QObjectCompatProperty<QItemSelectionModelPrivate,_QAbstractItemModel_*,_&QItemSelectionModelPrivate::_qt_property_model_offset,_&QItemSelectionModelPrivate::setModel,_&QItemSelectionModelPrivate::modelChanged,_nullptr>
    ::value(this_00);
    pQVar1 = (this_00->super_QPropertyData<QAbstractItemModel_*>).val;
    iVar2 = (*(pQVar1->super_QObject)._vptr_QObject[0xf])(pQVar1,&local_68);
    this->tableRowCount = iVar2;
    QObjectCompatProperty<QItemSelectionModelPrivate,_QAbstractItemModel_*,_&QItemSelectionModelPrivate::_qt_property_model_offset,_&QItemSelectionModelPrivate::setModel,_&QItemSelectionModelPrivate::modelChanged,_nullptr>
    ::value(this_00);
    pQVar1 = (this_00->super_QPropertyData<QAbstractItemModel_*>).val;
    iVar2 = (*(pQVar1->super_QObject)._vptr_QObject[0x10])(pQVar1,&local_68);
    this->tableColCount = iVar2;
    if (1000 < iVar2 * this->tableRowCount) {
      iVar2 = QPersistentModelIndex::row(&local_48.tl);
      if (iVar2 == 0) {
        iVar2 = QPersistentModelIndex::column(&local_48.tl);
        if (iVar2 == 0) {
          iVar2 = QPersistentModelIndex::row(&local_48.br);
          if (iVar2 == this->tableRowCount + -1) {
            iVar2 = QPersistentModelIndex::column(&local_48.br);
            if (iVar2 == this->tableColCount + -1) {
              this->tableSelected = true;
              QPersistentModelIndex::operator=(&this->tableParent,&local_68);
              QItemSelectionRange::~QItemSelectionRange(&local_48);
              goto LAB_00401ecf;
            }
          }
        }
      }
    }
    QItemSelectionRange::~QItemSelectionRange(&local_48);
  }
  this->tableSelected = false;
  if (hint == VerticalSortHint) {
    qSelectionPersistentRowLengths
              ((QList<std::pair<QPersistentModelIndex,_unsigned_int>_> *)&local_68,&this->ranges);
    QArrayDataPointer<std::pair<QPersistentModelIndex,_unsigned_int>_>::operator=
              (&(this->savedPersistentRowLengths).d,
               (QArrayDataPointer<std::pair<QPersistentModelIndex,_unsigned_int>_> *)&local_68);
    QArrayDataPointer<std::pair<QPersistentModelIndex,_unsigned_int>_>::~QArrayDataPointer
              ((QArrayDataPointer<std::pair<QPersistentModelIndex,_unsigned_int>_> *)&local_68);
    qSelectionPersistentRowLengths
              ((QList<std::pair<QPersistentModelIndex,_unsigned_int>_> *)&local_68,
               &this->currentSelection);
    QArrayDataPointer<std::pair<QPersistentModelIndex,_unsigned_int>_>::operator=
              (&(this->savedPersistentCurrentRowLengths).d,
               (QArrayDataPointer<std::pair<QPersistentModelIndex,_unsigned_int>_> *)&local_68);
    QArrayDataPointer<std::pair<QPersistentModelIndex,_unsigned_int>_>::~QArrayDataPointer
              ((QArrayDataPointer<std::pair<QPersistentModelIndex,_unsigned_int>_> *)&local_68);
  }
  else {
    qSelectionIndexes<QList<QPersistentModelIndex>>
              ((QList<QPersistentModelIndex> *)&local_68,&this->ranges);
    QArrayDataPointer<QPersistentModelIndex>::operator=
              (&(this->savedPersistentIndexes).d,
               (QArrayDataPointer<QPersistentModelIndex> *)&local_68);
    QArrayDataPointer<QPersistentModelIndex>::~QArrayDataPointer
              ((QArrayDataPointer<QPersistentModelIndex> *)&local_68);
    qSelectionIndexes<QList<QPersistentModelIndex>>
              ((QList<QPersistentModelIndex> *)&local_68,&this->currentSelection);
    QArrayDataPointer<QPersistentModelIndex>::operator=
              (&(this->savedPersistentCurrentIndexes).d,
               (QArrayDataPointer<QPersistentModelIndex> *)&local_68);
    QArrayDataPointer<QPersistentModelIndex>::~QArrayDataPointer
              ((QArrayDataPointer<QPersistentModelIndex> *)&local_68);
  }
LAB_00401ecf:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QItemSelectionModelPrivate::layoutAboutToBeChanged(const QList<QPersistentModelIndex> &,
                                                        QAbstractItemModel::LayoutChangeHint hint)
{
    savedPersistentIndexes.clear();
    savedPersistentCurrentIndexes.clear();
    savedPersistentRowLengths.clear();
    savedPersistentCurrentRowLengths.clear();

    // optimization for when all indexes are selected
    // (only if there is lots of items (1000) because this is not entirely correct)
    if (ranges.isEmpty() && currentSelection.size() == 1) {
        QItemSelectionRange range = currentSelection.constFirst();
        QModelIndex parent = range.parent();
        tableRowCount = model->rowCount(parent);
        tableColCount = model->columnCount(parent);
        if (tableRowCount * tableColCount > 1000
            && range.top() == 0
            && range.left() == 0
            && range.bottom() == tableRowCount - 1
            && range.right() == tableColCount - 1) {
            tableSelected = true;
            tableParent = parent;
            return;
        }
    }
    tableSelected = false;

    if (hint == QAbstractItemModel::VerticalSortHint) {
        // Special case when we know we're sorting vertically. We can assume that all indexes for columns
        // are displaced the same way, and therefore we only need to track an index from one column per
        // row with a QPersistentModelIndex together with the length of items to the right of it
        // which are displaced the same way.
        // An algorithm which contains the same assumption is used to process layoutChanged.
        savedPersistentRowLengths = qSelectionPersistentRowLengths(ranges);
        savedPersistentCurrentRowLengths = qSelectionPersistentRowLengths(currentSelection);
    } else {
        savedPersistentIndexes = qSelectionIndexes<QList<QPersistentModelIndex>>(ranges);
        savedPersistentCurrentIndexes = qSelectionIndexes<QList<QPersistentModelIndex>>(currentSelection);
    }
}